

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap32::VerifyMarkCountForPages<256u>
          (HeapBlockMap32 *this,void *address,uint pageCount)

{
  L2MapChunk *this_00;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  BVStatic<256UL> *this_01;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  BVIndex startOffset;
  uint uVar8;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x15e,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar3) goto LAB_00217887;
    *puVar1 = 0;
  }
  uVar8 = (uint)address >> 0xc;
  uVar5 = uVar8 & 0xff;
  uVar7 = pageCount + uVar5;
  if (0x100 < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x162,"(id2 + pageCount <= L2Count)","id2 + pageCount <= L2Count");
    if (!bVar3) {
LAB_00217887:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (uVar5 < uVar7) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    uVar8 = uVar8 & 0xff;
    uVar6 = (ulong)uVar8;
    startOffset = uVar8 << 8;
    do {
      this_01 = BVStatic<65536ul>::GetRange<256ul>((BVStatic<65536ul> *)this_00,startOffset);
      BVar4 = BVStatic<256UL>::Count(this_01);
      if (BVar4 != this_00->pageMarkCount[uVar6]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                           ,0x16a,"(markCountForPage == l2map->pageMarkCount[i])",
                           "markCountForPage == l2map->pageMarkCount[i]");
        if (!bVar3) goto LAB_00217887;
        *puVar1 = 0;
      }
      uVar6 = uVar6 + 1;
      startOffset = startOffset + 0x100;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

void
HeapBlockMap32::VerifyMarkCountForPages(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    Assert(id2 + pageCount <= L2Count);
    for (uint i = id2; i < pageCount + id2; i++)
    {
        uint markCountForPage = l2map->GetPageMarkBitVector(i)->Count();
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
        Assert(markCountForPage == l2map->pageMarkCount[i] || heapBlock->WasAllocatedFromDuringSweep());
#else
        Assert(markCountForPage == l2map->pageMarkCount[i]);
#endif
    }
}